

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd-tree-dense-points.cpp
# Opt level: O0

vector<PointT,_std::allocator<PointT>_> * read_csv(char *filename)

{
  byte bVar1;
  undefined8 in_RSI;
  vector<PointT,_std::allocator<PointT>_> *in_RDI;
  float fVar2;
  int i;
  char *token;
  PointT p;
  char line [256];
  ifstream ifs;
  vector<PointT,_std::allocator<PointT>_> *points;
  vector<PointT,_std::allocator<PointT>_> *this;
  int local_354;
  char *local_350;
  float local_344 [3];
  char local_338 [280];
  char local_220 [527];
  byte local_11;
  undefined8 local_10;
  
  local_11 = 0;
  this = in_RDI;
  local_10 = in_RSI;
  std::vector<PointT,_std::allocator<PointT>_>::vector
            ((vector<PointT,_std::allocator<PointT>_> *)0x111971);
  std::ifstream::ifstream(local_220,local_10,8);
  while( true ) {
    bVar1 = std::ios::eof();
    if (((bVar1 ^ 0xff) & 1) == 0) break;
    std::istream::getline(local_220,(long)local_338);
    local_350 = strtok(local_338,",");
    local_354 = 0;
    while (local_350 != (char *)0x0) {
      fVar2 = strtof(local_350,(char **)0x0);
      local_344[local_354] = fVar2;
      local_350 = strtok((char *)0x0,",");
      local_354 = local_354 + 1;
    }
    std::vector<PointT,_std::allocator<PointT>_>::push_back(this,(value_type *)in_RDI);
  }
  std::ifstream::close();
  local_11 = 1;
  std::ifstream::~ifstream(local_220);
  if ((local_11 & 1) == 0) {
    std::vector<PointT,_std::allocator<PointT>_>::~vector(this);
  }
  return this;
}

Assistant:

std::vector<PointT> read_csv(const char *filename)
{
  std::vector<PointT> points;
  std::ifstream ifs(filename);

  char line[256];
  while (!ifs.eof())
  {
    ifs.getline(line, 256);
    PointT p;
    char* token = strtok(line, ",");
    int i = 0;
    while (token != nullptr)
    {
      p.coords[i++] = std::strtof(token, nullptr);
      token = strtok(nullptr, ",");
    }
    points.push_back(p);
  }

  ifs.close();
  return points;
}